

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O0

Index __thiscall
anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>::degree_u
          (Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *this)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_> local_20;
  Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *local_10;
  Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *this_local;
  
  local_10 = this;
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::operator->
            ((Ref<anurbs::NurbsSurfaceGeometry<3L>_> *)&local_20);
  peVar2 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_20);
  iVar1 = (*(peVar2->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])();
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>::~shared_ptr(&local_20);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

Index degree_u() const override
    {
        return m_surface_geometry->degree_u();
    }